

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hh_sse41.h
# Opt level: O0

V2x64U __thiscall
highwayhash::SSE41::HHStateSSE41::LoadMultipleOfFour(HHStateSSE41 *this,char *bytes,size_t size)

{
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  longlong lVar1;
  longlong extraout_RDX_01;
  V2x64U VVar2;
  V128<unsigned_long> local_128;
  uint local_118;
  uint uStack_114;
  uint uStack_110;
  uint uStack_10c;
  undefined1 local_108 [8];
  V2x64U broadcast;
  __m128i word2;
  V128<unsigned_long> local_d8;
  longlong local_c8 [2];
  V128<unsigned_long> local_b8;
  longlong local_a8 [2];
  undefined1 local_98 [8];
  V2x64U mask4;
  uint32_t *words;
  size_t size_local;
  char *bytes_local;
  V2x64U *ret;
  ulong local_28;
  
  local_a8[0] = 0xffffffff;
  local_a8[1] = 0;
  mask4.v_[1] = (longlong)bytes;
  V128<unsigned_long>::V128((V128<unsigned_long> *)local_98,&local_a8);
  V128<unsigned_long>::V128(&this->v0L,0);
  lVar1 = extraout_RDX;
  if ((size & 8) != 0) {
    local_c8[0] = *(longlong *)mask4.v_[1];
    local_c8[1] = 0;
    V128<unsigned_long>::V128(&local_b8,&local_c8);
    V128<unsigned_long>::operator=(&this->v0L,&local_b8);
    V128::operator_cast_to_function_pointer((V128 *)local_98);
    word2[1] = 0;
    V128<unsigned_long>::V128(&local_d8,(Intrinsic *)(word2 + 1));
    V128<unsigned_long>::operator=((V128<unsigned_long> *)local_98,&local_d8);
    mask4.v_[1] = mask4.v_[1] + 8;
    lVar1 = extraout_RDX_00;
  }
  if ((size & 4) != 0) {
    local_118 = LoadUnaligned<unsigned_int>((void *)mask4.v_[1]);
    local_28 = (ulong)local_118;
    broadcast.v_[1] = local_28;
    word2[0] = 0;
    uStack_114 = local_118;
    uStack_110 = local_118;
    uStack_10c = local_118;
    V128<unsigned_long>::V128((V128<unsigned_long> *)local_108,(Intrinsic *)&local_118);
    operator&((SSE41 *)&local_128,(V128<unsigned_long> *)local_108,(V128<unsigned_long> *)local_98);
    V128<unsigned_long>::operator|=(&this->v0L,&local_128);
    lVar1 = extraout_RDX_01;
  }
  VVar2.v_[1] = lVar1;
  VVar2.v_[0] = (longlong)this;
  return (V2x64U)VVar2.v_;
}

Assistant:

static HH_INLINE V2x64U LoadMultipleOfFour(const char* bytes,
                                             const size_t size) {
    const uint32_t* words = reinterpret_cast<const uint32_t*>(bytes);
    // Mask of 1-bits where the final 4 bytes should be inserted (replacement
    // for variable shift/insert using broadcast+blend).
    V2x64U mask4(_mm_cvtsi64_si128(0xFFFFFFFFULL));  // 'insert' into lane 0
    V2x64U ret(0);
    if (size & 8) {
      ret = V2x64U(_mm_loadl_epi64(reinterpret_cast<const __m128i*>(words)));
      // mask4 = 0 ~0 0 0 ('insert' into lane 2)
      mask4 = V2x64U(_mm_slli_si128(mask4, 8));
      words += 2;
    }
    // Final 4 (possibly after the 8 above); 'insert' into lane 0 or 2 of ret.
    if (size & 4) {
      const __m128i word2 = _mm_cvtsi32_si128(LoadUnaligned<uint32_t>(words));
      // = 0 word2 0 word2; mask4 will select which lane to keep.
      const V2x64U broadcast(_mm_shuffle_epi32(word2, 0x00));
      // (slightly faster than blendv_epi8)
      ret |= V2x64U(broadcast & mask4);
    }
    return ret;
  }